

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.h
# Opt level: O0

size_t spdlog::details::os::filesize(FILE *f)

{
  int iVar1;
  spdlog_ex *psVar2;
  int *piVar3;
  allocator<char> local_101;
  string local_100;
  undefined1 local_e0 [8];
  stat64 st;
  int fd;
  allocator<char> local_31;
  string local_30;
  FILE *local_10;
  FILE *f_local;
  
  local_10 = f;
  if (f == (FILE *)0x0) {
    psVar2 = (spdlog_ex *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Failed getting file size. fd is null",&local_31);
    spdlog_ex::spdlog_ex(psVar2,&local_30);
    __cxa_throw(psVar2,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
  }
  st.__glibc_reserved[2]._4_4_ = fileno((FILE *)f);
  iVar1 = fstat64(st.__glibc_reserved[2]._4_4_,(stat64 *)local_e0);
  if (iVar1 == 0) {
    return st.st_rdev;
  }
  psVar2 = (spdlog_ex *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"Failed getting file size from fd",&local_101);
  piVar3 = __errno_location();
  spdlog_ex::spdlog_ex(psVar2,&local_100,*piVar3);
  __cxa_throw(psVar2,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

inline size_t filesize(FILE *f)
{
    if (f == nullptr)
    {
        throw spdlog_ex("Failed getting file size. fd is null");
    }
#if defined(_WIN32) && !defined(__CYGWIN__)
    int fd = _fileno(f);
#if _WIN64 // 64 bits
    __int64 ret = _filelengthi64(fd);
    if (ret >= 0)
    {
        return static_cast<size_t>(ret);
    }

#else // windows 32 bits
    long ret = _filelength(fd);
    if (ret >= 0)
    {
        return static_cast<size_t>(ret);
    }
#endif

#else // unix
    int fd = fileno(f);
// 64 bits(but not in osx or cygwin, where fstat64 is deprecated)
#if !defined(__FreeBSD__) && !defined(__APPLE__) && (defined(__x86_64__) || defined(__ppc64__)) && !defined(__CYGWIN__)
    struct stat64 st;
    if (fstat64(fd, &st) == 0)
    {
        return static_cast<size_t>(st.st_size);
    }
#else // unix 32 bits or cygwin
    struct stat st;

    if (fstat(fd, &st) == 0)
    {
        return static_cast<size_t>(st.st_size);
    }
#endif
#endif
    throw spdlog_ex("Failed getting file size from fd", errno);
}